

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O2

void __thiscall UnifiedRegex::DebugWriter::PrintEscapedChar(DebugWriter *this,Char c)

{
  ushort uVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  
  uVar2 = CONCAT62(in_register_00000032,c);
  CheckForNewline(this);
  uVar1 = (ushort)(uVar2 & 0xffffffff);
  if (0xff < uVar1) {
    Output::Print(L"\\u%lc%lc%lc%lc",(ulong)(ushort)L"0123456789abcdef"[uVar2 >> 0xc & 0xfffff],
                  (ulong)*(ushort *)
                          ((long)L"0123456789abcdef" +
                          (ulong)((uint)((uVar2 & 0xffffffff) >> 7) & 0x1e)),
                  (ulong)*(ushort *)((long)L"0123456789abcdef" + (ulong)((uint)(uVar2 >> 3) & 0x1e))
                  ,(ulong)(ushort)L"0123456789abcdef"[(uint)uVar2 & 0xf]);
    return;
  }
  if (uVar1 == 0x2d) {
    Output::Print(L"\\x2d");
    return;
  }
  if ((ushort)(c + L'ﾁ') < 0xffa1) {
    Output::Print(L"\\x%lc%lc",(ulong)(ushort)L"0123456789abcdef"[uVar2 >> 4 & 0xfffffff],
                  (ulong)(ushort)L"0123456789abcdef"[(uint)uVar2 & 0xf]);
    return;
  }
  Output::Print(L"%lc",uVar2 & 0xffffffff);
  return;
}

Assistant:

void DebugWriter::PrintEscapedChar(const Char c)
    {
        CheckForNewline();
        if (c > 0xff)
            Output::Print(_u("\\u%lc%lc%lc%lc"), hex[c >> 12], hex[(c >> 8) & 0xf], hex[(c >> 4) & 0xf], hex[c & 0xf]);
        else if (c == '-')
            Output::Print(_u("\\x2d"));
        else if (c < ' ' || c > '~')
            Output::Print(_u("\\x%lc%lc"), hex[c >> 4], hex[c & 0xf]);
        else
            Output::Print(_u("%lc"), c);
    }